

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O2

void __thiscall Strategy::~Strategy(Strategy *this)

{
  char cVar1;
  
  this->_vptr_Strategy = (_func_int **)&PTR__Strategy_00118d18;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::close();
  }
  if (this->m_a != (CFGsContainer *)0x0) {
    (*this->m_a->_vptr_CFGsContainer[1])();
  }
  if (this->m_b != (CFGsContainer *)0x0) {
    (*this->m_b->_vptr_CFGsContainer[1])();
  }
  if ((this->m_config).instrs != (char *)0x0) {
    Instruction::clear();
  }
  std::ofstream::~ofstream(&this->m_fout);
  StrategyConfig::~StrategyConfig(&this->m_config);
  return;
}

Assistant:

Strategy::~Strategy() {
	if (m_fout.is_open())
		m_fout.close();

	if (m_a)
		delete m_a;

	if (m_b)
		delete m_b;

	if (m_config.instrs)
		Instruction::clear();
}